

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O3

void convolve_2d_sr_ver_8tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ulong uVar15;
  int32_t iVar16;
  long lVar17;
  long lVar18;
  undefined1 (*pauVar19) [32];
  long lVar20;
  int16_t *piVar21;
  int16_t *piVar22;
  __m128i d0;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 local_3c8 [32];
  undefined1 local_378 [32];
  undefined1 local_358 [32];
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [32];
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  
  uVar15 = (ulong)((subpel_y_q4 & 0xfU) * (uint)filter_params_y->taps);
  piVar21 = filter_params_y->filter_ptr;
  if (w == 2) {
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)im_block;
    auVar24 = vpshufd_avx(auVar23,0x55);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *(ulong *)(im_block + 4);
    auVar53 = vpshufd_avx(auVar31,0x55);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = *(ulong *)(im_block + 8);
    auVar30 = vpshufd_avx(auVar47,0x55);
    uVar3 = *(uint *)(im_block + 0xc);
    auVar34 = vpunpckldq_avx(auVar24,auVar31);
    auVar35 = vpunpckldq_avx(auVar53,auVar47);
    auVar24 = vpinsrd_avx(auVar30,*(undefined4 *)(im_block + 0xc),1);
    auVar53 = vpunpcklwd_avx(auVar23,auVar34);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = *(ulong *)(im_block + 4);
    auVar30 = vpunpcklwd_avx(auVar32,auVar35);
    uVar1 = *(undefined4 *)(piVar21 + uVar15);
    auVar29._4_4_ = uVar1;
    auVar29._0_4_ = uVar1;
    auVar29._8_4_ = uVar1;
    auVar29._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar21 + uVar15 + 2);
    auVar33._4_4_ = uVar1;
    auVar33._0_4_ = uVar1;
    auVar33._8_4_ = uVar1;
    auVar33._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar21 + uVar15 + 4);
    auVar38._4_4_ = uVar1;
    auVar38._0_4_ = uVar1;
    auVar38._8_4_ = uVar1;
    auVar38._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar21 + uVar15 + 6);
    auVar40._4_4_ = uVar1;
    auVar40._0_4_ = uVar1;
    auVar40._8_4_ = uVar1;
    auVar40._12_4_ = uVar1;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = *(ulong *)(im_block + 8);
    auVar24 = vpunpcklwd_avx(auVar48,auVar24);
    lVar18 = 0;
    auVar50._8_4_ = 0x400;
    auVar50._0_8_ = 0x40000000400;
    auVar50._12_4_ = 0x400;
    do {
      auVar41 = auVar30;
      auVar30 = vpmaddwd_avx(auVar53,auVar29);
      auVar53 = vpinsrd_avx(ZEXT416(uVar3),*(undefined4 *)(im_block + lVar18 * 2 + 0xe),1);
      auVar34 = vpmaddwd_avx(auVar24,auVar38);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)(im_block + lVar18 * 2 + 0xe);
      auVar35 = vpunpcklwd_avx(auVar53,auVar54);
      auVar53 = vpmaddwd_avx(auVar41,auVar33);
      auVar53 = vpaddd_avx(auVar30,auVar53);
      uVar3 = *(uint *)(im_block + lVar18 * 2 + 0x10);
      auVar53 = vpaddd_avx(auVar53,auVar34);
      auVar53 = vpaddd_avx(auVar53,auVar50);
      auVar30 = vpmaddwd_avx(auVar35,auVar40);
      auVar53 = vpaddd_avx(auVar53,auVar30);
      auVar53 = vpsrad_avx(auVar53,0xb);
      auVar53 = vpackssdw_avx(auVar53,auVar53);
      auVar53 = vpackuswb_avx(auVar53,auVar53);
      vpextrw_avx(auVar53,0);
      vpextrw_avx(auVar53,1);
      lVar18 = lVar18 + 2;
      auVar30 = auVar24;
      auVar24 = auVar35;
      auVar53 = auVar41;
    } while (h != (int)lVar18);
  }
  else {
    uVar1 = *(undefined4 *)(piVar21 + uVar15);
    auVar58._4_4_ = uVar1;
    auVar58._0_4_ = uVar1;
    auVar58._8_4_ = uVar1;
    auVar58._12_4_ = uVar1;
    auVar58._16_4_ = uVar1;
    auVar58._20_4_ = uVar1;
    auVar58._24_4_ = uVar1;
    auVar58._28_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar21 + uVar15 + 2);
    auVar57._4_4_ = uVar1;
    auVar57._0_4_ = uVar1;
    auVar57._8_4_ = uVar1;
    auVar57._12_4_ = uVar1;
    auVar57._16_4_ = uVar1;
    auVar57._20_4_ = uVar1;
    auVar57._24_4_ = uVar1;
    auVar57._28_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar21 + uVar15 + 4);
    uVar2 = *(undefined4 *)(piVar21 + uVar15 + 6);
    if (w == 4) {
      uVar15 = *(ulong *)(im_block + 0x18);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)(im_block + 4);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)im_block;
      auVar46._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar53;
      auVar46._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar34;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *(ulong *)(im_block + 8);
      auVar56._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar34;
      auVar56._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar41;
      auVar46 = vpunpcklwd_avx2(auVar46,auVar56);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(im_block + 0xc);
      auVar37._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar41;
      auVar37._16_16_ = ZEXT116(1) * auVar30;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)(im_block + 0x10);
      auVar52._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar30;
      auVar52._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar42;
      auVar52 = vpunpcklwd_avx2(auVar37,auVar52);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)(im_block + 0x14);
      auVar51._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar42;
      auVar51._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar35;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar15;
      auVar27._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar35;
      auVar27._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
      auVar56 = vpunpcklwd_avx2(auVar51,auVar27);
      lVar18 = 0;
      auVar36._8_4_ = 0x400;
      auVar36._0_8_ = 0x40000000400;
      auVar36._12_4_ = 0x400;
      auVar36._16_4_ = 0x400;
      auVar36._20_4_ = 0x400;
      auVar36._24_4_ = 0x400;
      auVar36._28_4_ = 0x400;
      do {
        auVar51 = auVar52;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)(im_block + lVar18 * 4 + 0x1c);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar15;
        auVar49._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar25;
        auVar49._16_16_ = ZEXT116(1) * auVar45;
        uVar15 = *(ulong *)(im_block + lVar18 * 4 + 0x20);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar15;
        auVar28._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar45;
        auVar28._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
        auVar46 = vpmaddwd_avx2(auVar58,auVar46);
        auVar52 = vpmaddwd_avx2(auVar57,auVar51);
        auVar4._4_4_ = uVar1;
        auVar4._0_4_ = uVar1;
        auVar4._8_4_ = uVar1;
        auVar4._12_4_ = uVar1;
        auVar4._16_4_ = uVar1;
        auVar4._20_4_ = uVar1;
        auVar4._24_4_ = uVar1;
        auVar4._28_4_ = uVar1;
        auVar37 = vpmaddwd_avx2(auVar56,auVar4);
        auVar27 = vpunpcklwd_avx2(auVar49,auVar28);
        auVar46 = vpaddd_avx2(auVar52,auVar46);
        auVar46 = vpaddd_avx2(auVar37,auVar46);
        auVar46 = vpaddd_avx2(auVar46,auVar36);
        auVar55._4_4_ = uVar2;
        auVar55._0_4_ = uVar2;
        auVar55._8_4_ = uVar2;
        auVar55._12_4_ = uVar2;
        auVar55._16_4_ = uVar2;
        auVar55._20_4_ = uVar2;
        auVar55._24_4_ = uVar2;
        auVar55._28_4_ = uVar2;
        auVar52 = vpmaddwd_avx2(auVar27,auVar55);
        auVar46 = vpaddd_avx2(auVar46,auVar52);
        auVar46 = vpsrad_avx2(auVar46,0xb);
        auVar46 = vpackssdw_avx2(auVar46,auVar46);
        auVar46 = vpackuswb_avx2(auVar46,auVar46);
        *(int *)dst = auVar46._0_4_;
        *(int *)(dst + dst_stride) = auVar46._16_4_;
        dst = dst + dst_stride * 2;
        lVar18 = lVar18 + 2;
        auVar52 = auVar56;
        auVar46 = auVar51;
        auVar56 = auVar27;
      } while (h != (int)lVar18);
    }
    else if (w == 8) {
      auVar46 = *(undefined1 (*) [32])im_block;
      auVar52 = *(undefined1 (*) [32])(im_block + 8);
      auVar56 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar37 = *(undefined1 (*) [32])(im_block + 0x18);
      auVar36 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar27 = *(undefined1 (*) [32])(im_block + 0x28);
      if (subpel_y_q4 == 8) {
        pauVar19 = (undefined1 (*) [32])(im_block + 0x38);
        auVar39._8_4_ = 0x400;
        auVar39._0_8_ = 0x40000000400;
        auVar39._12_4_ = 0x400;
        auVar39._16_4_ = 0x400;
        auVar39._20_4_ = 0x400;
        auVar39._24_4_ = 0x400;
        auVar39._28_4_ = 0x400;
        do {
          auVar6 = auVar37;
          auVar5 = auVar56;
          auVar51 = *pauVar19;
          auVar56 = vpaddw_avx2(auVar51,auVar46);
          auVar37 = vpaddw_avx2(auVar27,auVar5);
          auVar55 = vpaddw_avx2(auVar36,auVar6);
          auVar46 = *(undefined1 (*) [32])(pauVar19[-1] + 0x10);
          auVar52 = vpaddw_avx2(auVar46,auVar52);
          auVar28 = vpunpcklwd_avx2(auVar56,auVar52);
          auVar49 = vpunpcklwd_avx2(auVar37,auVar55);
          auVar4 = vpunpckhwd_avx2(auVar56,auVar52);
          auVar55 = vpunpckhwd_avx2(auVar37,auVar55);
          auVar56 = vpmaddwd_avx2(auVar28,auVar58);
          auVar52 = vpmaddwd_avx2(auVar49,auVar57);
          auVar37 = vpmaddwd_avx2(auVar58,auVar4);
          auVar55 = vpmaddwd_avx2(auVar55,auVar57);
          auVar52 = vpaddd_avx2(auVar52,auVar39);
          auVar52 = vpaddd_avx2(auVar56,auVar52);
          auVar56 = vpsrad_avx2(auVar52,0xb);
          auVar52 = vpaddd_avx2(auVar55,auVar39);
          auVar52 = vpaddd_avx2(auVar52,auVar37);
          auVar52 = vpsrad_avx2(auVar52,0xb);
          auVar52 = vpackssdw_avx2(auVar56,auVar52);
          auVar52 = vpackuswb_avx2(auVar52,auVar36);
          *(long *)dst = auVar52._0_8_;
          *(long *)(dst + dst_stride) = auVar52._16_8_;
          dst = dst + dst_stride * 2;
          pauVar19 = pauVar19 + 1;
          h = h + -2;
          auVar56 = auVar36;
          auVar37 = auVar27;
          auVar27 = auVar51;
          auVar52 = auVar6;
          auVar36 = auVar46;
          auVar46 = auVar5;
        } while (h != 0);
      }
      else {
        auVar51 = vpunpcklwd_avx2(auVar46,auVar52);
        auVar55 = vpunpcklwd_avx2(auVar56,auVar37);
        auVar4 = vpunpcklwd_avx2(auVar36,auVar27);
        auVar46 = vpunpckhwd_avx2(auVar46,auVar52);
        auVar52 = vpunpckhwd_avx2(auVar56,auVar37);
        auVar56 = vpunpckhwd_avx2(auVar36,auVar27);
        pauVar19 = (undefined1 (*) [32])(im_block + 0x38);
        local_3c8._8_4_ = 0x400;
        local_3c8._0_8_ = 0x40000000400;
        local_3c8._12_4_ = 0x400;
        local_3c8._16_4_ = 0x400;
        local_3c8._20_4_ = 0x400;
        local_3c8._24_4_ = 0x400;
        local_3c8._28_4_ = 0x400;
        do {
          auVar5 = auVar55;
          auVar37 = vpmaddwd_avx2(auVar51,auVar58);
          auVar27 = vpmaddwd_avx2(auVar5,auVar57);
          auVar7._4_4_ = uVar1;
          auVar7._0_4_ = uVar1;
          auVar7._8_4_ = uVar1;
          auVar7._12_4_ = uVar1;
          auVar7._16_4_ = uVar1;
          auVar7._20_4_ = uVar1;
          auVar7._24_4_ = uVar1;
          auVar7._28_4_ = uVar1;
          auVar36 = vpmaddwd_avx2(auVar7,auVar4);
          auVar39 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar19[-1] + 0x10),*pauVar19);
          auVar51 = vpmaddwd_avx2(auVar58,auVar46);
          auVar55 = vpmaddwd_avx2(auVar52,auVar57);
          auVar28 = vpmaddwd_avx2(auVar7,auVar56);
          auVar49 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar19[-1] + 0x10),*pauVar19);
          auVar46 = vpaddd_avx2(auVar37,auVar27);
          auVar46 = vpaddd_avx2(auVar36,auVar46);
          auVar37 = vpaddd_avx2(auVar51,auVar55);
          auVar6._4_4_ = uVar2;
          auVar6._0_4_ = uVar2;
          auVar6._8_4_ = uVar2;
          auVar6._12_4_ = uVar2;
          auVar6._16_4_ = uVar2;
          auVar6._20_4_ = uVar2;
          auVar6._24_4_ = uVar2;
          auVar6._28_4_ = uVar2;
          auVar27 = vpmaddwd_avx2(auVar6,auVar39);
          auVar37 = vpaddd_avx2(auVar28,auVar37);
          auVar36 = vpmaddwd_avx2(auVar6,auVar49);
          auVar46 = vpaddd_avx2(local_3c8,auVar46);
          auVar46 = vpaddd_avx2(auVar27,auVar46);
          auVar27 = vpsrad_avx2(auVar46,0xb);
          auVar46 = vpaddd_avx2(local_3c8,auVar37);
          auVar46 = vpaddd_avx2(auVar36,auVar46);
          auVar46 = vpsrad_avx2(auVar46,0xb);
          auVar46 = vpackssdw_avx2(auVar27,auVar46);
          auVar46 = vpackuswb_avx2(auVar46,auVar56);
          *(long *)dst = auVar46._0_8_;
          *(long *)(dst + dst_stride) = auVar46._16_8_;
          dst = dst + dst_stride * 2;
          pauVar19 = pauVar19 + 1;
          h = h + -2;
          auVar55 = auVar4;
          auVar46 = auVar52;
          auVar51 = auVar5;
          auVar52 = auVar56;
          auVar56 = auVar49;
          auVar4 = auVar39;
        } while (h != 0);
      }
    }
    else if (w == 0x10) {
      auVar46 = *(undefined1 (*) [32])im_block;
      auVar52 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar56 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar37 = *(undefined1 (*) [32])(im_block + 0x30);
      auVar51 = *(undefined1 (*) [32])(im_block + 0x40);
      auVar36 = *(undefined1 (*) [32])(im_block + 0x50);
      auVar27 = *(undefined1 (*) [32])(im_block + 0x60);
      auVar44 = ZEXT3264(auVar27);
      if (subpel_y_q4 == 8) {
        pauVar19 = (undefined1 (*) [32])(im_block + 0x80);
        local_378._8_4_ = 0x400;
        local_378._0_8_ = 0x40000000400;
        local_378._12_4_ = 0x400;
        local_378._16_4_ = 0x400;
        local_378._20_4_ = 0x400;
        local_378._24_4_ = 0x400;
        local_378._28_4_ = 0x400;
        do {
          auVar9 = auVar37;
          auVar37 = *pauVar19;
          auVar43 = auVar44._0_32_;
          auVar27 = vpaddw_avx2(auVar52,auVar43);
          auVar55 = vpaddw_avx2(auVar52,auVar37);
          auVar52 = pauVar19[-1];
          auVar46 = vpaddw_avx2(auVar52,auVar46);
          auVar4 = vpaddw_avx2(auVar56,auVar36);
          auVar28 = vpaddw_avx2(auVar52,auVar56);
          auVar49 = vpaddw_avx2(auVar9,auVar51);
          auVar5 = vpunpcklwd_avx2(auVar46,auVar27);
          auVar6 = vpunpcklwd_avx2(auVar4,auVar49);
          auVar39 = vpunpckhwd_avx2(auVar46,auVar27);
          auVar4 = vpunpckhwd_avx2(auVar4,auVar49);
          auVar46 = vpaddw_avx2(auVar9,auVar43);
          auVar27 = vpaddw_avx2(auVar51,auVar36);
          auVar7 = vpunpcklwd_avx2(auVar55,auVar28);
          auVar28 = vpunpckhwd_avx2(auVar55,auVar28);
          auVar8 = vpunpcklwd_avx2(auVar46,auVar27);
          auVar49 = vpunpckhwd_avx2(auVar46,auVar27);
          auVar27 = vpmaddwd_avx2(auVar5,auVar58);
          auVar46 = vpmaddwd_avx2(auVar6,auVar57);
          auVar46 = vpaddd_avx2(auVar46,local_378);
          auVar46 = vpaddd_avx2(auVar27,auVar46);
          auVar55 = vpmaddwd_avx2(auVar58,auVar39);
          auVar27 = vpmaddwd_avx2(auVar4,auVar57);
          auVar27 = vpaddd_avx2(auVar27,local_378);
          auVar27 = vpaddd_avx2(auVar27,auVar55);
          auVar55 = vpsrad_avx2(auVar46,0xb);
          auVar46 = vpsrad_avx2(auVar27,0xb);
          auVar46 = vpackssdw_avx2(auVar55,auVar46);
          auVar55 = vpmaddwd_avx2(auVar58,auVar7);
          auVar27 = vpmaddwd_avx2(auVar8,auVar57);
          auVar27 = vpaddd_avx2(auVar27,local_378);
          auVar27 = vpaddd_avx2(auVar27,auVar55);
          auVar4 = vpmaddwd_avx2(auVar58,auVar28);
          auVar55 = vpmaddwd_avx2(auVar49,auVar57);
          auVar55 = vpaddd_avx2(auVar55,local_378);
          auVar55 = vpaddd_avx2(auVar55,auVar4);
          auVar27 = vpsrad_avx2(auVar27,0xb);
          auVar55 = vpsrad_avx2(auVar55,0xb);
          auVar27 = vpackssdw_avx2(auVar27,auVar55);
          auVar46 = vpackuswb_avx2(auVar46,auVar27);
          auVar46 = vpermq_avx2(auVar46,0xd8);
          *(undefined1 (*) [16])dst = auVar46._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar46._16_16_;
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          pauVar19 = pauVar19 + 2;
          auVar44 = ZEXT3264(auVar37);
          h = h + -2;
          auVar46 = auVar56;
          auVar56 = auVar51;
          auVar37 = auVar36;
          auVar36 = auVar52;
          auVar51 = auVar43;
          auVar52 = auVar9;
        } while (h != 0);
      }
      else {
        auVar28 = vpunpcklwd_avx2(auVar46,auVar52);
        auVar49 = vpunpcklwd_avx2(auVar56,auVar37);
        auVar6 = vpunpcklwd_avx2(auVar51,auVar36);
        auVar46 = vpunpckhwd_avx2(auVar46,auVar52);
        auVar55 = vpunpckhwd_avx2(auVar56,auVar37);
        auVar4 = vpunpckhwd_avx2(auVar51,auVar36);
        auVar39 = vpunpcklwd_avx2(auVar52,auVar56);
        local_3c8 = vpunpcklwd_avx2(auVar37,auVar51);
        auVar5 = vpunpcklwd_avx2(auVar36,auVar27);
        auVar52 = vpunpckhwd_avx2(auVar52,auVar56);
        auVar56 = vpunpckhwd_avx2(auVar37,auVar51);
        auVar37 = vpunpckhwd_avx2(auVar36,auVar27);
        pauVar19 = (undefined1 (*) [32])(im_block + 0x80);
        local_2d8._8_4_ = 0x400;
        local_2d8._0_8_ = 0x40000000400;
        local_2d8._12_4_ = 0x400;
        local_2d8._16_4_ = 0x400;
        local_2d8._20_4_ = 0x400;
        local_2d8._24_4_ = 0x400;
        local_2d8._28_4_ = 0x400;
        do {
          auVar9 = auVar5;
          auVar11 = auVar49;
          auVar36 = vpmaddwd_avx2(auVar39,auVar58);
          auVar51 = vpmaddwd_avx2(auVar57,local_3c8);
          auVar49 = vpmaddwd_avx2(auVar52,auVar58);
          auVar39 = vpmaddwd_avx2(auVar57,auVar56);
          auVar52 = vpmaddwd_avx2(auVar28,auVar58);
          auVar27 = vpmaddwd_avx2(auVar57,auVar11);
          auVar28 = vpmaddwd_avx2(auVar46,auVar58);
          auVar46 = vpaddd_avx2(auVar52,auVar27);
          auVar12._4_4_ = uVar1;
          auVar12._0_4_ = uVar1;
          auVar12._8_4_ = uVar1;
          auVar12._12_4_ = uVar1;
          auVar12._16_4_ = uVar1;
          auVar12._20_4_ = uVar1;
          auVar12._24_4_ = uVar1;
          auVar12._28_4_ = uVar1;
          auVar52 = vpmaddwd_avx2(auVar6,auVar12);
          auVar52 = vpaddd_avx2(auVar46,auVar52);
          auVar46 = vpmaddwd_avx2(auVar55,auVar57);
          auVar46 = vpaddd_avx2(auVar46,auVar28);
          auVar27 = vpmaddwd_avx2(auVar4,auVar12);
          auVar27 = vpaddd_avx2(auVar46,auVar27);
          auVar46 = pauVar19[-1];
          auVar36 = vpaddd_avx2(auVar36,auVar51);
          auVar51 = vpmaddwd_avx2(auVar9,auVar12);
          auVar36 = vpaddd_avx2(auVar36,auVar51);
          auVar43 = vpunpcklwd_avx2(auVar44._0_32_,auVar46);
          auVar7 = vpunpckhwd_avx2(auVar44._0_32_,auVar46);
          auVar51 = vpaddd_avx2(auVar49,auVar39);
          auVar28 = vpmaddwd_avx2(auVar37,auVar12);
          auVar51 = vpaddd_avx2(auVar51,auVar28);
          auVar10._4_4_ = uVar2;
          auVar10._0_4_ = uVar2;
          auVar10._8_4_ = uVar2;
          auVar10._12_4_ = uVar2;
          auVar10._16_4_ = uVar2;
          auVar10._20_4_ = uVar2;
          auVar10._24_4_ = uVar2;
          auVar10._28_4_ = uVar2;
          auVar28 = vpmaddwd_avx2(auVar43,auVar10);
          auVar52 = vpaddd_avx2(local_2d8,auVar52);
          auVar28 = vpaddd_avx2(auVar52,auVar28);
          auVar49 = vpmaddwd_avx2(auVar7,auVar10);
          auVar52 = vpaddd_avx2(auVar27,local_2d8);
          auVar27 = vpaddd_avx2(auVar52,auVar49);
          auVar52 = *pauVar19;
          auVar44 = ZEXT3264(auVar52);
          auVar28 = vpsrad_avx2(auVar28,0xb);
          auVar27 = vpsrad_avx2(auVar27,0xb);
          auVar27 = vpackssdw_avx2(auVar28,auVar27);
          auVar5 = vpunpcklwd_avx2(auVar46,auVar52);
          auVar36 = vpaddd_avx2(auVar36,local_2d8);
          auVar28 = vpmaddwd_avx2(auVar5,auVar10);
          auVar36 = vpaddd_avx2(auVar36,auVar28);
          auVar8 = vpunpckhwd_avx2(auVar46,auVar52);
          auVar46 = vpaddd_avx2(local_2d8,auVar51);
          auVar52 = vpmaddwd_avx2(auVar8,auVar10);
          auVar46 = vpaddd_avx2(auVar46,auVar52);
          auVar52 = vpsrad_avx2(auVar36,0xb);
          auVar46 = vpsrad_avx2(auVar46,0xb);
          auVar46 = vpackssdw_avx2(auVar52,auVar46);
          auVar46 = vpackuswb_avx2(auVar27,auVar46);
          auVar46 = vpermq_avx2(auVar46,0xd8);
          *(undefined1 (*) [16])dst = auVar46._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar46._16_16_;
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          pauVar19 = pauVar19 + 2;
          h = h + -2;
          auVar49 = auVar6;
          auVar46 = auVar55;
          auVar55 = auVar4;
          auVar28 = auVar11;
          auVar52 = auVar56;
          auVar39 = local_3c8;
          auVar56 = auVar37;
          auVar4 = auVar7;
          auVar6 = auVar43;
          auVar37 = auVar8;
          local_3c8 = auVar9;
        } while (h != 0);
      }
    }
    else {
      lVar18 = (long)w;
      piVar21 = im_block + lVar18 * 8 + 0x10;
      piVar22 = im_block + lVar18 * 7 + 0x10;
      lVar20 = 0;
      auVar5._4_4_ = uVar2;
      auVar5._0_4_ = uVar2;
      auVar5._8_4_ = uVar2;
      auVar5._12_4_ = uVar2;
      auVar5._16_4_ = uVar2;
      auVar5._20_4_ = uVar2;
      auVar5._24_4_ = uVar2;
      auVar5._28_4_ = uVar2;
      do {
        pauVar19 = (undefined1 (*) [32])(dst + lVar20);
        auVar51 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 6);
        auVar46 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18);
        auVar52 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 + 0x10);
        auVar4 = vpunpcklwd_avx2(*(undefined1 (*) [32])(im_block + lVar20),auVar46);
        auVar56 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 2);
        auVar37 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 3);
        local_3c8 = vpunpcklwd_avx2(auVar56,auVar37);
        auVar27 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 4);
        auVar36 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 5);
        local_2f8 = vpunpcklwd_avx2(auVar27,auVar36);
        auVar55 = vpunpckhwd_avx2(*(undefined1 (*) [32])(im_block + lVar20),auVar46);
        local_358 = vpunpckhwd_avx2(auVar56,auVar37);
        local_1d8 = vpunpckhwd_avx2(auVar27,auVar36);
        auVar28 = vpunpcklwd_avx2(auVar46,auVar56);
        local_378 = vpunpcklwd_avx2(auVar37,auVar27);
        auVar56 = vpunpckhwd_avx2(auVar46,auVar56);
        auVar49 = vpunpcklwd_avx2(auVar36,auVar51);
        local_2b8 = vpunpckhwd_avx2(auVar37,auVar27);
        auVar37 = vpunpckhwd_avx2(auVar36,auVar51);
        auVar27 = vpunpcklwd_avx2(*(undefined1 (*) [32])(im_block + lVar20 + 0x10),auVar52);
        local_238 = vpunpckhwd_avx2(*(undefined1 (*) [32])(im_block + lVar20 + 0x10),auVar52);
        auVar46 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 2 + 0x10);
        local_278 = vpunpcklwd_avx2(auVar52,auVar46);
        local_258 = vpunpckhwd_avx2(auVar52,auVar46);
        auVar52 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 3 + 0x10);
        local_2d8 = vpunpcklwd_avx2(auVar46,auVar52);
        local_178 = vpunpckhwd_avx2(auVar46,auVar52);
        auVar46 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 4 + 0x10);
        local_198 = vpunpcklwd_avx2(auVar52,auVar46);
        local_1b8 = vpunpckhwd_avx2(auVar52,auVar46);
        auVar52 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 5 + 0x10);
        local_218 = vpunpcklwd_avx2(auVar46,auVar52);
        local_1f8 = vpunpckhwd_avx2(auVar46,auVar52);
        auVar46 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 6 + 0x10);
        auVar36 = vpunpcklwd_avx2(auVar52,auVar46);
        auVar52 = vpunpckhwd_avx2(auVar52,auVar46);
        lVar17 = 0;
        auVar8._8_4_ = 0x400;
        auVar8._0_8_ = 0x40000000400;
        auVar8._12_4_ = 0x400;
        auVar8._16_4_ = 0x400;
        auVar8._20_4_ = 0x400;
        auVar8._24_4_ = 0x400;
        auVar8._28_4_ = 0x400;
        iVar16 = h;
        do {
          auVar6 = auVar52;
          auVar9 = auVar36;
          auVar7 = auVar37;
          auVar43 = auVar49;
          auVar14 = local_178;
          auVar13 = local_2d8;
          auVar12 = local_358;
          auVar10 = local_3c8;
          auVar52 = vpmaddwd_avx2(auVar58,auVar4);
          auVar37 = vpmaddwd_avx2(local_3c8,auVar57);
          auVar52 = vpaddd_avx2(auVar37,auVar52);
          local_3c8 = local_2f8;
          auVar11._4_4_ = uVar1;
          auVar11._0_4_ = uVar1;
          auVar11._8_4_ = uVar1;
          auVar11._12_4_ = uVar1;
          auVar11._16_4_ = uVar1;
          auVar11._20_4_ = uVar1;
          auVar11._24_4_ = uVar1;
          auVar11._28_4_ = uVar1;
          auVar37 = vpmaddwd_avx2(local_2f8,auVar11);
          auVar52 = vpaddd_avx2(auVar37,auVar52);
          auVar37 = vpmaddwd_avx2(auVar58,auVar55);
          auVar36 = vpmaddwd_avx2(local_358,auVar57);
          auVar37 = vpaddd_avx2(auVar37,auVar36);
          local_358 = local_1d8;
          auVar36 = vpmaddwd_avx2(local_1d8,auVar11);
          auVar37 = vpaddd_avx2(auVar37,auVar36);
          auVar36 = vpmaddwd_avx2(auVar28,auVar58);
          auVar55 = vpmaddwd_avx2(local_378,auVar57);
          auVar36 = vpaddd_avx2(auVar55,auVar36);
          auVar55 = vpmaddwd_avx2(auVar43,auVar11);
          auVar36 = vpaddd_avx2(auVar55,auVar36);
          auVar56 = vpmaddwd_avx2(auVar58,auVar56);
          auVar55 = vpmaddwd_avx2(local_2b8,auVar57);
          auVar56 = vpaddd_avx2(auVar56,auVar55);
          auVar55 = vpmaddwd_avx2(auVar7,auVar11);
          auVar55 = vpaddd_avx2(auVar56,auVar55);
          auVar56 = vpmaddwd_avx2(auVar27,auVar58);
          auVar27 = vpmaddwd_avx2(local_2d8,auVar57);
          auVar56 = vpaddd_avx2(auVar27,auVar56);
          local_2d8 = local_218;
          auVar27 = vpmaddwd_avx2(local_218,auVar11);
          auVar56 = vpaddd_avx2(auVar27,auVar56);
          auVar27 = vpmaddwd_avx2(auVar58,local_238);
          auVar4 = vpmaddwd_avx2(local_178,auVar57);
          auVar27 = vpaddd_avx2(auVar27,auVar4);
          local_178 = local_1f8;
          auVar4 = vpmaddwd_avx2(local_1f8,auVar11);
          auVar27 = vpaddd_avx2(auVar27,auVar4);
          auVar4 = vpmaddwd_avx2(auVar58,local_278);
          local_278 = local_198;
          auVar28 = vpmaddwd_avx2(local_198,auVar57);
          auVar4 = vpaddd_avx2(auVar4,auVar28);
          auVar28 = vpmaddwd_avx2(auVar9,auVar11);
          auVar4 = vpaddd_avx2(auVar4,auVar28);
          auVar28 = vpmaddwd_avx2(auVar58,local_258);
          auVar49 = vpmaddwd_avx2(local_1b8,auVar57);
          auVar28 = vpaddd_avx2(auVar28,auVar49);
          auVar49 = vpmaddwd_avx2(auVar6,auVar11);
          auVar28 = vpaddd_avx2(auVar28,auVar49);
          auVar49 = vpaddd_avx2(auVar8,auVar52);
          auVar52 = *(undefined1 (*) [32])((long)piVar22 + lVar17 + -0x20);
          local_2f8 = vpunpcklwd_avx2(auVar51,auVar52);
          auVar39 = vpmaddwd_avx2(local_2f8,auVar5);
          auVar49 = vpaddd_avx2(auVar49,auVar39);
          local_1d8 = vpunpckhwd_avx2(auVar51,auVar52);
          auVar37 = vpaddd_avx2(auVar37,auVar8);
          auVar51 = vpmaddwd_avx2(local_1d8,auVar5);
          auVar37 = vpaddd_avx2(auVar37,auVar51);
          auVar51 = vpsrad_avx2(auVar49,0xb);
          auVar37 = vpsrad_avx2(auVar37,0xb);
          auVar37 = vpackssdw_avx2(auVar51,auVar37);
          auVar51 = vpaddd_avx2(auVar56,auVar8);
          auVar56 = *(undefined1 (*) [32])((long)piVar22 + lVar17);
          local_218 = vpunpcklwd_avx2(auVar46,auVar56);
          auVar49 = vpmaddwd_avx2(local_218,auVar5);
          auVar51 = vpaddd_avx2(auVar49,auVar51);
          local_1f8 = vpunpckhwd_avx2(auVar46,auVar56);
          auVar46 = vpaddd_avx2(auVar27,auVar8);
          auVar27 = vpmaddwd_avx2(local_1f8,auVar5);
          auVar46 = vpaddd_avx2(auVar27,auVar46);
          auVar27 = vpsrad_avx2(auVar51,0xb);
          auVar46 = vpsrad_avx2(auVar46,0xb);
          auVar46 = vpackssdw_avx2(auVar27,auVar46);
          auVar37 = vpackuswb_avx2(auVar37,auVar46);
          auVar51 = *(undefined1 (*) [32])((long)piVar21 + lVar17 + -0x20);
          auVar46 = *(undefined1 (*) [32])((long)piVar21 + lVar17);
          *pauVar19 = auVar37;
          auVar37 = vpaddd_avx2(auVar8,auVar36);
          auVar49 = vpunpcklwd_avx2(auVar52,auVar51);
          auVar27 = vpmaddwd_avx2(auVar49,auVar5);
          auVar27 = vpaddd_avx2(auVar27,auVar37);
          auVar37 = vpunpckhwd_avx2(auVar52,auVar51);
          auVar52 = vpaddd_avx2(auVar55,auVar8);
          auVar36 = vpmaddwd_avx2(auVar37,auVar5);
          auVar52 = vpaddd_avx2(auVar36,auVar52);
          auVar27 = vpsrad_avx2(auVar27,0xb);
          auVar52 = vpsrad_avx2(auVar52,0xb);
          auVar27 = vpackssdw_avx2(auVar27,auVar52);
          auVar52 = vpaddd_avx2(auVar4,auVar8);
          auVar36 = vpunpcklwd_avx2(auVar56,auVar46);
          auVar55 = vpmaddwd_avx2(auVar36,auVar5);
          auVar55 = vpaddd_avx2(auVar55,auVar52);
          auVar52 = vpunpckhwd_avx2(auVar56,auVar46);
          auVar56 = vpaddd_avx2(auVar28,auVar8);
          auVar4 = vpmaddwd_avx2(auVar52,auVar5);
          auVar56 = vpaddd_avx2(auVar56,auVar4);
          auVar55 = vpsrad_avx2(auVar55,0xb);
          auVar56 = vpsrad_avx2(auVar56,0xb);
          auVar56 = vpackssdw_avx2(auVar55,auVar56);
          auVar56 = vpackuswb_avx2(auVar27,auVar56);
          *(undefined1 (*) [32])(*pauVar19 + dst_stride) = auVar56;
          local_238 = auVar14;
          local_258 = local_1b8;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + dst_stride * 2);
          lVar17 = lVar17 + (long)(w * 2) * 2;
          iVar16 = iVar16 + -2;
          auVar56 = local_2b8;
          auVar55 = auVar12;
          auVar4 = auVar10;
          auVar27 = auVar13;
          auVar28 = local_378;
          local_378 = auVar43;
          local_2b8 = auVar7;
          local_1b8 = auVar6;
          local_198 = auVar9;
        } while (iVar16 != 0);
        lVar20 = lVar20 + 0x20;
        piVar21 = piVar21 + 0x20;
        piVar22 = piVar22 + 0x20;
      } while (lVar20 < lVar18);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_8tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y;

  if (w == 2) {
    __m128i coeffs_128[4], s_32[8], ss_128[4];

    prepare_coeffs_8tap_sse2(filter_params_y, subpel_y_q4, coeffs_128);

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)(im + 0 * 2));
    s_32[1] = _mm_cvtsi32_si128(*(int32_t *)(im + 1 * 2));
    s_32[2] = _mm_cvtsi32_si128(*(int32_t *)(im + 2 * 2));
    s_32[3] = _mm_cvtsi32_si128(*(int32_t *)(im + 3 * 2));
    s_32[4] = _mm_cvtsi32_si128(*(int32_t *)(im + 4 * 2));
    s_32[5] = _mm_cvtsi32_si128(*(int32_t *)(im + 5 * 2));
    s_32[6] = _mm_cvtsi32_si128(*(int32_t *)(im + 6 * 2));

    const __m128i src01 = _mm_unpacklo_epi32(s_32[0], s_32[1]);
    const __m128i src12 = _mm_unpacklo_epi32(s_32[1], s_32[2]);
    const __m128i src23 = _mm_unpacklo_epi32(s_32[2], s_32[3]);
    const __m128i src34 = _mm_unpacklo_epi32(s_32[3], s_32[4]);
    const __m128i src45 = _mm_unpacklo_epi32(s_32[4], s_32[5]);
    const __m128i src56 = _mm_unpacklo_epi32(s_32[5], s_32[6]);

    ss_128[0] = _mm_unpacklo_epi16(src01, src12);
    ss_128[1] = _mm_unpacklo_epi16(src23, src34);
    ss_128[2] = _mm_unpacklo_epi16(src45, src56);

    y = h;
    do {
      const __m128i res =
          xy_y_convolve_8tap_2x2_sse2(im, s_32, ss_128, coeffs_128);
      xy_y_round_store_2x2_sse2(res, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i coeffs_256[4];

    prepare_coeffs_8tap_avx2(filter_params_y, subpel_y_q4, coeffs_256);

    if (w == 4) {
      __m128i s_64[8];
      __m256i s_256[8], ss_256[4];

      s_64[0] = _mm_loadl_epi64((__m128i *)(im + 0 * 4));
      s_64[1] = _mm_loadl_epi64((__m128i *)(im + 1 * 4));
      s_64[2] = _mm_loadl_epi64((__m128i *)(im + 2 * 4));
      s_64[3] = _mm_loadl_epi64((__m128i *)(im + 3 * 4));
      s_64[4] = _mm_loadl_epi64((__m128i *)(im + 4 * 4));
      s_64[5] = _mm_loadl_epi64((__m128i *)(im + 5 * 4));
      s_64[6] = _mm_loadl_epi64((__m128i *)(im + 6 * 4));

      // Load lines a and b. Line a to lower 128, line b to upper 128
      s_256[0] = _mm256_setr_m128i(s_64[0], s_64[1]);
      s_256[1] = _mm256_setr_m128i(s_64[1], s_64[2]);
      s_256[2] = _mm256_setr_m128i(s_64[2], s_64[3]);
      s_256[3] = _mm256_setr_m128i(s_64[3], s_64[4]);
      s_256[4] = _mm256_setr_m128i(s_64[4], s_64[5]);
      s_256[5] = _mm256_setr_m128i(s_64[5], s_64[6]);

      ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
      ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);
      ss_256[2] = _mm256_unpacklo_epi16(s_256[4], s_256[5]);

      y = h;
      do {
        const __m256i res =
            xy_y_convolve_8tap_4x2_avx2(im, s_64, ss_256, coeffs_256);
        xy_y_round_store_4x2_avx2(res, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 8) {
      __m256i s_256[8], r[2];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 8));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 8));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 8));
      s_256[3] = _mm256_loadu_si256((__m256i *)(im + 3 * 8));
      s_256[4] = _mm256_loadu_si256((__m256i *)(im + 4 * 8));
      s_256[5] = _mm256_loadu_si256((__m256i *)(im + 5 * 8));
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[8];

        convolve_8tap_unpack_avx2(s_256, ss_256);

        do {
          xy_y_convolve_8tap_8x2_avx2(im, ss_256, coeffs_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_8tap_8x2_half_pel_avx2(im, coeffs_256, s_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else if (w == 16) {
      __m256i s_256[8], r[4];

      load_16bit_7rows_avx2(im, 16, s_256);
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[8], tt_256[8];

        convolve_8tap_unpack_avx2(s_256, ss_256);
        convolve_8tap_unpack_avx2(s_256 + 1, tt_256);

        do {
          xy_y_convolve_8tap_16x2_avx2(im, 16, coeffs_256, s_256, ss_256,
                                       tt_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);

          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_8tap_16x2_half_pel_avx2(im, 16, coeffs_256, s_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);

          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else {
      int32_t x = 0;
      __m256i s_256[2][8], r0[4], r1[4];

      assert(!(w % 32));

      __m256i ss_256[2][8], tt_256[2][8];

      do {
        const int16_t *s = im + x;
        uint8_t *d = dst + x;

        load_16bit_7rows_avx2(s, w, s_256[0]);
        convolve_8tap_unpack_avx2(s_256[0], ss_256[0]);
        convolve_8tap_unpack_avx2(s_256[0] + 1, tt_256[0]);

        load_16bit_7rows_avx2(s + 16, w, s_256[1]);
        convolve_8tap_unpack_avx2(s_256[1], ss_256[1]);
        convolve_8tap_unpack_avx2(s_256[1] + 1, tt_256[1]);

        y = h;
        do {
          xy_y_convolve_8tap_16x2_avx2(s, w, coeffs_256, s_256[0], ss_256[0],
                                       tt_256[0], r0);
          xy_y_convolve_8tap_16x2_avx2(s + 16, w, coeffs_256, s_256[1],
                                       ss_256[1], tt_256[1], r1);
          xy_y_round_store_32_avx2(r0 + 0, r1 + 0, d);
          xy_y_round_store_32_avx2(r0 + 2, r1 + 2, d + dst_stride);

          s += 2 * w;
          d += 2 * dst_stride;
          y -= 2;
        } while (y);

        x += 32;
      } while (x < w);
    }
  }
}